

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

int __thiscall KDIS::NETWORK::Connection::shutdown(Connection *this,int __fd,int __how)

{
  bool bVar1;
  int in_EAX;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  bool bVar3;
  Connection *this_01;
  long lVar4;
  allocator<char> local_39;
  KString local_38;
  
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if (this->m_iSocket[lVar4] != 0) {
      in_EAX = close(this->m_iSocket[lVar4]);
      if (in_EAX == -1) {
        this_01 = (Connection *)0x30;
        this_00 = (KException *)__cxa_allocate_exception();
        piVar2 = __errno_location();
        __s = getErrorText(this_01,*piVar2);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
        KException::KException(this_00,&local_38,0xc);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      this->m_iSocket[lVar4] = 0;
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  return in_EAX;
}

Assistant:

void Connection::shutdown() noexcept(false)
{
    for( KINT8 i = 0; i < 2; ++i )
    {
        if( m_iSocket[i] )
        {
            #if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )
                KINT32 iError = closesocket( m_iSocket[i] );
            #else
                KINT32 iError = close( m_iSocket[i] );
            #endif

            if( iError == SOCKET_ERROR )
            {
                THROW_ERROR;
            }

            m_iSocket[i] = 0;
        }
    }
}